

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__readval(stbi__context *s,int channel,stbi_uc *dest)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi_uc *psVar4;
  stbi_uc *psVar5;
  long lVar6;
  uint uVar7;
  
  psVar1 = s->buffer_start;
  uVar7 = 0x80;
  lVar6 = 0;
  do {
    if ((uVar7 & channel) != 0) {
      if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0028d77a:
        psVar4 = s->img_buffer;
        psVar5 = s->img_buffer_end;
        if (psVar5 <= psVar4) {
LAB_0028d81b:
          stbi__g_failure_reason = "bad file";
          return (stbi_uc *)0x0;
        }
      }
      else {
        iVar3 = (*(s->io).eof)(s->io_user_data);
        if (iVar3 != 0) {
          if (s->read_from_callbacks == 0) goto LAB_0028d81b;
          goto LAB_0028d77a;
        }
        psVar4 = s->img_buffer;
        psVar5 = s->img_buffer_end;
      }
      if (psVar4 < psVar5) {
        s->img_buffer = psVar4 + 1;
        sVar2 = *psVar4;
      }
      else if (s->read_from_callbacks == 0) {
        sVar2 = '\0';
      }
      else {
        iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar3 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          sVar2 = '\0';
          psVar4 = s->buffer_start + 1;
        }
        else {
          sVar2 = *psVar1;
          psVar4 = psVar1 + iVar3;
        }
        s->img_buffer_end = psVar4;
        s->img_buffer = s->buffer_start + 1;
      }
      dest[lVar6] = sVar2;
    }
    lVar6 = lVar6 + 1;
    uVar7 = uVar7 >> 1;
    if (lVar6 == 4) {
      return dest;
    }
  } while( true );
}

Assistant:

static stbi_uc *stbi__readval(stbi__context *s, int channel, stbi_uc *dest)
{
   int mask=0x80, i;

   for (i=0; i<4; ++i, mask>>=1) {
      if (channel & mask) {
         if (stbi__at_eof(s)) return stbi__errpuc("bad file","PIC file too short");
         dest[i]=stbi__get8(s);
      }
   }

   return dest;
}